

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

int __thiscall
NNTreeImpl::binarySearch
          (NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int num_items,
          bool return_prev_if_not_found,offset_in_NNTreeImpl_to_subr compare)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  code *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  code *in_stack_00000008;
  long in_stack_00000010;
  uint local_54;
  
  uVar10 = 1;
  do {
    uVar6 = uVar10;
    iVar4 = (int)uVar6;
    uVar10 = (ulong)(uint)(iVar4 * 2);
  } while (iVar4 < num_items);
  plVar1 = (long *)((long)&this->details + in_stack_00000010);
  uVar10 = 0xffffffffffffffff;
  bVar9 = false;
  uVar8 = (long)iVar4 / 2 & 0xffffffff;
  local_54 = (uint)((long)iVar4 / 2);
  do {
    bVar3 = false;
    do {
      if ((bVar3) || (uVar7 = (uint)uVar6, (int)uVar7 < 1)) {
        iVar4 = -1;
        if (return_prev_if_not_found) {
          iVar4 = (int)uVar10;
        }
        if (!bVar9) {
          iVar4 = -1;
        }
        if (bVar3) {
          iVar4 = (int)uVar10;
        }
        return iVar4;
      }
      if (num_items <= (int)uVar8) {
        iVar4 = -1;
        break;
      }
      pcVar5 = in_stack_00000008;
      if (((ulong)in_stack_00000008 & 1) != 0) {
        pcVar5 = *(code **)(in_stack_00000008 + *plVar1 + -1);
      }
      iVar4 = (*pcVar5)(plVar1,key,items,uVar8);
      bVar9 = (bool)(bVar9 | -1 < iVar4);
      bVar3 = true;
      uVar10 = uVar10 & 0xffffffff;
      if (-1 < iVar4) {
        uVar10 = uVar8;
      }
    } while (iVar4 == 0);
    uVar6 = uVar6 >> 1;
    if (1 < uVar7) {
      uVar7 = (int)local_54 >> 1;
      if (local_54 < 2) {
        uVar7 = 1;
      }
      uVar2 = -uVar7;
      if (-1 < iVar4) {
        uVar2 = uVar7;
      }
      uVar8 = (ulong)((int)uVar8 + uVar2);
      local_54 = uVar7;
    }
  } while( true );
}

Assistant:

int
NNTreeImpl::binarySearch(
    QPDFObjectHandle key,
    QPDFObjectHandle items,
    int num_items,
    bool return_prev_if_not_found,
    int (NNTreeImpl::*compare)(QPDFObjectHandle& key, QPDFObjectHandle& arr, int item))
{
    int max_idx = 1;
    while (max_idx < num_items) {
        max_idx <<= 1;
    }

    int step = max_idx / 2;
    int checks = max_idx;
    int idx = step;
    int found_idx = -1;
    bool found = false;
    bool found_leq = false;
    int status = 0;

    while ((!found) && (checks > 0)) {
        if (idx < num_items) {
            status = (this->*compare)(key, items, idx);
            if (status >= 0) {
                found_leq = true;
                found_idx = idx;
            }
        } else {
            // consider item to be below anything after the top
            status = -1;
        }

        if (status == 0) {
            found = true;
        } else {
            checks >>= 1;
            if (checks > 0) {
                step >>= 1;
                if (step == 0) {
                    step = 1;
                }

                if (status < 0) {
                    idx -= step;
                } else {
                    idx += step;
                }
            }
        }
    }

    if (found || (found_leq && return_prev_if_not_found)) {
        return found_idx;
    } else {
        return -1;
    }
}